

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUSSEImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUSSEImpl<double,_1,_1>::calcStatesStates
          (BeagleCPUSSEImpl<double,_1,_1> *this,double *destP,int *states_q,double *matrices_q,
          int *states_r,double *matrices_r,int startPattern,int endPattern)

{
  BeagleCPUImpl<double,_1,_1>::calcStatesStates
            (&this->super_BeagleCPUImpl<double,_1,_1>,destP,states_q,matrices_q,states_r,matrices_r,
             startPattern,endPattern);
  return;
}

Assistant:

BEAGLE_CPU_SSE_TEMPLATE
void BeagleCPUSSEImpl<BEAGLE_CPU_SSE_DOUBLE>::calcStatesStates(double* destP,
                                                               const int* states_q,
                                                               const double* matrices_q,
                                                               const int* states_r,
                                                               const double* matrices_r,
                                                               int startPattern,
                                                               int endPattern) {

	BeagleCPUImpl<BEAGLE_CPU_SSE_DOUBLE>::calcStatesStates(destP,
                                                           states_q,
                                                           matrices_q,
                                                           states_r,
                                                           matrices_r,
                                                           startPattern,
                                                           endPattern);
}